

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintThreeBBShaft::Increment_q(ChConstraintThreeBBShaft *this,double deltal)

{
  double dVar1;
  undefined1 auVar2 [16];
  ChVariables *pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Index size;
  Index index;
  ulong uVar7;
  Index index_1;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [16];
  ulong *local_28;
  long local_20;
  
  pCVar3 = (this->super_ChConstraintThree).variables_a;
  if (pCVar3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_28,pCVar3);
    if (local_20 != 6) goto LAB_007f6b5c;
    uVar7 = 6;
    if ((((ulong)local_28 & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)local_28 >> 3) & 0x1fffffff) & 7), 5 < uVar7)) {
      uVar7 = 6;
    }
    uVar10 = -uVar7 + 6;
    uVar9 = -uVar7 + 0xd;
    if (-1 < (long)uVar10) {
      uVar9 = uVar10;
    }
    auVar4._8_8_ = in_XMM0_Qb;
    auVar4._0_8_ = deltal;
    if (uVar7 != 0) {
      uVar11 = 0;
      do {
        local_28[uVar11] =
             (ulong)(deltal * (this->Eq_a).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[uVar11] + (double)local_28[uVar11]);
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    lVar8 = (uVar9 & 0xfffffffffffffff8) + uVar7;
    if (7 < (long)uVar10) {
      auVar12 = vbroadcastsd_avx512f(auVar4);
      do {
        auVar13 = vmulpd_avx512f(auVar12,*(undefined1 (*) [64])
                                          ((this->Eq_a).
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array + uVar7));
        auVar13 = vaddpd_avx512f(auVar13,*(undefined1 (*) [64])(local_28 + uVar7));
        *(undefined1 (*) [64])(local_28 + uVar7) = auVar13;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < lVar8);
    }
    if (lVar8 < 6) {
      do {
        local_28[lVar8] =
             (ulong)(deltal * (this->Eq_a).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[lVar8] + (double)local_28[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
    }
  }
  pCVar3 = (this->super_ChConstraintThree).variables_b;
  if (pCVar3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_28,pCVar3);
    if (local_20 != 6) {
LAB_007f6b5c:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 6, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 6, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    auVar5._8_8_ = in_XMM0_Qb;
    auVar5._0_8_ = deltal;
    uVar7 = 6;
    if ((((ulong)local_28 & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)local_28 >> 3) & 0x1fffffff) & 7), 5 < uVar7)) {
      uVar7 = 6;
    }
    uVar10 = -uVar7 + 6;
    uVar9 = -uVar7 + 0xd;
    if (-1 < (long)uVar10) {
      uVar9 = uVar10;
    }
    if (uVar7 != 0) {
      uVar11 = 0;
      do {
        local_28[uVar11] =
             (ulong)(deltal * (this->Eq_b).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[uVar11] + (double)local_28[uVar11]);
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    lVar8 = (uVar9 & 0xfffffffffffffff8) + uVar7;
    if (7 < (long)uVar10) {
      auVar12 = vbroadcastsd_avx512f(auVar5);
      do {
        auVar13 = vmulpd_avx512f(auVar12,*(undefined1 (*) [64])
                                          ((this->Eq_b).
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array + uVar7));
        auVar13 = vaddpd_avx512f(auVar13,*(undefined1 (*) [64])(local_28 + uVar7));
        *(undefined1 (*) [64])(local_28 + uVar7) = auVar13;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < lVar8);
    }
    if (lVar8 < 6) {
      do {
        local_28[lVar8] =
             (ulong)(deltal * (this->Eq_b).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[lVar8] + (double)local_28[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
    }
  }
  pCVar3 = (this->super_ChConstraintThree).variables_c;
  if (pCVar3->disabled == false) {
    dVar1 = (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
            m_data.array[0];
    ChVariables::Get_qb((ChVectorRef *)&local_28,pCVar3);
    if (local_20 < 1) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                   );
    }
    auVar6._8_8_ = in_XMM0_Qb;
    auVar6._0_8_ = deltal;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *local_28;
    auVar4 = vfmadd213sd_fma(auVar6,auVar14,auVar2);
    *local_28 = auVar4._0_8_;
  }
  return;
}

Assistant:

void ChConstraintThreeBBShaft::Increment_q(const double deltal) {
    if (variables_a->IsActive()) {
        variables_a->Get_qb() += Eq_a * deltal;
    }

    if (variables_b->IsActive()) {
        variables_b->Get_qb() += Eq_b * deltal;
    }

    if (variables_c->IsActive()) {
        variables_c->Get_qb()(0) += Eq_c(0) * deltal;
    }
}